

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::print_update(search_private *priv)

{
  bool bVar1;
  long *in_RDI;
  char total_exge [8];
  char total_cach [8];
  char total_pred [8];
  char inst_cntr [9];
  bool use_heldout_loss;
  float avg_loss_since;
  float avg_loss;
  char pred_label [21];
  char true_label [21];
  char *header_fmt;
  vw *all;
  char *in_stack_fffffffffffffe58;
  undefined8 uVar2;
  vw *in_stack_fffffffffffffe60;
  shared_data *this;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  float local_16c;
  float local_164;
  bool local_109;
  undefined1 local_f2 [8];
  undefined1 local_ea [16];
  undefined1 local_da [9];
  bool local_d1;
  float local_d0;
  float local_cc;
  string local_c8 [48];
  string local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  char *local_38;
  long *local_30;
  long *local_28;
  
  local_30 = (long *)*in_RDI;
  local_28 = in_RDI;
  if (((*(byte *)(in_RDI + 0x4e) & 1) == 0) && ((*(byte *)((long)local_30 + 0x3439) & 1) == 0)) {
    local_38 = "%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n";
    fprintf(_stderr,"%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n","average","since",
            "instance","current true","current predicted","cur","cur","predic","cache","examples",""
           );
    if ((*(byte *)((long)local_28 + 0x611) & 1) == 0) {
      in_stack_fffffffffffffe58 = "output prefix";
      in_stack_fffffffffffffe60 = (vw *)0x3ffb5a;
      in_stack_fffffffffffffe70 = "made";
      in_stack_fffffffffffffe78 = "hits";
      in_stack_fffffffffffffe80 = "gener";
      fprintf(_stderr,local_38,"loss","last","counter","output prefix","output prefix","pass","pol")
      ;
    }
    else {
      in_stack_fffffffffffffe58 = "output prefix";
      in_stack_fffffffffffffe60 = (vw *)0x3ffb5a;
      in_stack_fffffffffffffe70 = "made";
      in_stack_fffffffffffffe78 = "hits";
      in_stack_fffffffffffffe80 = "gener";
      fprintf(_stderr,local_38,"loss","last","counter","output prefix","output prefix","pass","pol")
      ;
    }
    std::ios_base::precision((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),5);
    *(undefined1 *)(local_28 + 0x4e) = 1;
  }
  bVar1 = should_print_update(in_stack_fffffffffffffe60,
                              SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
  if (bVar1) {
    std::__cxx11::stringstream::str();
    to_short_string((string *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                    in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::stringstream::str();
    to_short_string((string *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                    in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_c8);
    local_cc = 0.0;
    local_d0 = 0.0;
    local_109 = false;
    if (((*(byte *)((long)local_30 + 0x3457) & 1) == 0) && (local_109 = false, local_30[9] != 0)) {
      local_109 = 0.0 < *(double *)(*local_30 + 0x78);
    }
    local_d1 = local_109;
    if (local_109 == false) {
      local_cc = safediv((float)*(double *)(*local_30 + 0x40),(float)*(double *)(*local_30 + 0x20));
      local_d0 = safediv((float)*(double *)(*local_30 + 0x48),
                         (float)(*(double *)(*local_30 + 0x20) - *(double *)(*local_30 + 0x28)));
    }
    else {
      local_cc = safediv((float)*(double *)(*local_30 + 0x90),(float)*(double *)(*local_30 + 0x78));
      local_d0 = safediv((float)*(double *)(*local_30 + 0x88),(float)*(double *)(*local_30 + 0x80));
      *(undefined8 *)(*local_30 + 0x80) = 0;
      *(undefined8 *)(*local_30 + 0x88) = 0;
    }
    number_to_natural((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    number_to_natural((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    number_to_natural((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    number_to_natural((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    this = (shared_data *)(local_ea + 8);
    if ((*(byte *)((long)local_28 + 0x611) & 1) == 0) {
      local_16c = *(float *)(local_28 + 0x52);
    }
    else {
      local_164 = (float)(ulong)local_28[0x4b];
      local_16c = local_164;
    }
    uVar2 = CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)local_28[0x56]);
    fprintf(_stderr,"%-10.6f %-10.6f %8s  [%s] [%s] %5d %5d  %7s  %7s  %7s  %-8f",(double)local_cc,
            (double)local_d0,(double)local_16c,local_da,local_58,local_78,
            local_28[0x5b] & 0xffffffff,uVar2,this,local_ea,local_f2);
    if ((local_d1 & 1U) != 0) {
      fprintf(_stderr," h");
    }
    fprintf(_stderr,"\n");
    fflush(_stderr);
    shared_data::update_dump_interval(this,SUB81((ulong)uVar2 >> 0x38,0),(float)uVar2);
  }
  return;
}

Assistant:

void print_update(search_private& priv)
{
  vw& all = *priv.all;
  if (!priv.printed_output_header && !all.quiet)
  {
    const char* header_fmt = "%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n";
    fprintf(stderr, header_fmt, "average", "since", "instance", "current true", "current predicted", "cur", "cur",
        "predic", "cache", "examples", "");
    if (priv.active_csoaa)
      fprintf(stderr, header_fmt, "loss", "last", "counter", "output prefix", "output prefix", "pass", "pol", "made",
          "hits", "gener", "#run");
    else
      fprintf(stderr, header_fmt, "loss", "last", "counter", "output prefix", "output prefix", "pass", "pol", "made",
          "hits", "gener", "beta");
    std::cerr.precision(5);
    priv.printed_output_header = true;
  }

  if (!should_print_update(all, priv.hit_new_pass))
    return;

  char true_label[21];
  char pred_label[21];
  to_short_string(priv.truth_string->str(), 20, true_label);
  to_short_string(priv.pred_string->str(), 20, pred_label);

  float avg_loss = 0.;
  float avg_loss_since = 0.;
  bool use_heldout_loss = (!all.holdout_set_off && all.current_pass >= 1) && (all.sd->weighted_holdout_examples > 0);
  if (use_heldout_loss)
  {
    avg_loss = safediv((float)all.sd->holdout_sum_loss, (float)all.sd->weighted_holdout_examples);
    avg_loss_since = safediv(
        (float)all.sd->holdout_sum_loss_since_last_dump, (float)all.sd->weighted_holdout_examples_since_last_dump);

    all.sd->weighted_holdout_examples_since_last_dump = 0;
    all.sd->holdout_sum_loss_since_last_dump = 0.0;
  }
  else
  {
    avg_loss = safediv((float)all.sd->sum_loss, (float)all.sd->weighted_labeled_examples);
    avg_loss_since = safediv((float)all.sd->sum_loss_since_last_dump,
        (float)(all.sd->weighted_labeled_examples - all.sd->old_weighted_labeled_examples));
  }

  char inst_cntr[9];
  number_to_natural((size_t)all.sd->example_number, inst_cntr);
  char total_pred[8];
  number_to_natural(priv.total_predictions_made, total_pred);
  char total_cach[8];
  number_to_natural(priv.total_cache_hits, total_cach);
  char total_exge[8];
  number_to_natural(priv.total_examples_generated, total_exge);

  fprintf(stderr, "%-10.6f %-10.6f %8s  [%s] [%s] %5d %5d  %7s  %7s  %7s  %-8f", avg_loss, avg_loss_since, inst_cntr,
      true_label, pred_label, (int)priv.read_example_last_pass, (int)priv.current_policy, total_pred, total_cach,
      total_exge, priv.active_csoaa ? priv.num_calls_to_run : priv.beta);

  if (PRINT_CLOCK_TIME)
  {
    size_t num_sec = (size_t)(((float)(clock() - priv.start_clock_time)) / CLOCKS_PER_SEC);
    cerr << " " << num_sec << "sec";
  }

  if (use_heldout_loss)
    fprintf(stderr, " h");

  fprintf(stderr, "\n");
  fflush(stderr);
  all.sd->update_dump_interval(all.progress_add, all.progress_arg);
}